

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpEvaluate_Hermite
              (ARKodeMem_conflict ark_mem,ARKInterp interp,sunrealtype tau,int d,int order,
              N_Vector yout)

{
  int iVar1;
  N_Vector yout_00;
  uint in_ECX;
  int in_EDX;
  long *in_RSI;
  ARKodeMem in_RDI;
  N_Vector in_R8;
  double in_XMM0_Qa;
  N_Vector X [6];
  sunrealtype a [6];
  sunrealtype h5;
  sunrealtype h4;
  sunrealtype h3;
  sunrealtype h2;
  sunrealtype h;
  sunrealtype tau5;
  sunrealtype tau4;
  sunrealtype tau3;
  sunrealtype tau2;
  sunrealtype a1;
  sunrealtype a0;
  sunrealtype tval;
  int retval;
  int q;
  uint order_00;
  sunrealtype in_stack_ffffffffffffff08;
  ARKInterp in_stack_ffffffffffffff10;
  ARKodeMem_conflict in_stack_ffffffffffffff18;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  int local_38;
  uint local_34;
  N_Vector local_30;
  int local_24;
  
  local_58 = in_XMM0_Qa * in_XMM0_Qa;
  local_60 = in_XMM0_Qa * local_58;
  local_68 = in_XMM0_Qa * local_60;
  local_70 = in_XMM0_Qa * local_68;
  local_78 = *(double *)(*in_RSI + 0x38);
  local_80 = local_78 * local_78;
  local_88 = local_78 * local_80;
  local_90 = local_78 * local_88;
  local_98 = local_78 * local_90;
  if ((int)in_ECX < 1) {
    in_ECX = 0;
  }
  order_00 = in_ECX;
  if (*(int *)*in_RSI <= (int)in_ECX) {
    order_00 = *(uint *)*in_RSI;
  }
  local_34 = order_00;
  local_30 = in_R8;
  local_24 = in_EDX;
  if (in_RDI->fn_is_current == 0) {
    iVar1 = (*in_RDI->step_fullrhs)(in_RDI,in_RDI->tn,in_RDI->yn,in_RDI->fn,1);
    if (iVar1 != 0) {
      return -8;
    }
    in_RDI->fn_is_current = 1;
    local_38 = 0;
  }
  if (local_24 < 0) {
    arkProcessError(in_RDI,-0x16,0x1e0,"arkInterpEvaluate_Hermite",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_interp.c"
                    ,"Requested illegal derivative.");
    iVar1 = -0x16;
  }
  else if ((int)local_34 < local_24) {
    N_VConst(local_30);
    iVar1 = 0;
  }
  else {
    yout_00 = (N_Vector)(ulong)local_34;
    switch(yout_00) {
    case (N_Vector)0x0:
      N_VLinearSum(*(undefined8 *)(*in_RSI + 0x10),in_RDI->yn,local_30);
      break;
    case (N_Vector)0x1:
      if (local_24 == 0) {
        local_48 = -in_XMM0_Qa;
        local_50 = in_XMM0_Qa + 1.0;
      }
      else {
        local_48 = -1.0 / local_78;
        local_50 = 1.0 / local_78;
      }
      N_VLinearSum(local_48,local_50,*(undefined8 *)(*in_RSI + 0x10),in_RDI->yn,local_30);
      break;
    case (N_Vector)0x2:
      if (local_24 == 0) {
        local_c8 = local_58;
        local_c0 = 1.0 - local_58;
        local_b8 = local_78 * (local_58 + in_XMM0_Qa);
      }
      else {
        if (local_24 == 1) {
          local_c8 = in_XMM0_Qa * 2.0;
          local_c0 = in_XMM0_Qa * -2.0;
          local_b8 = in_XMM0_Qa + in_XMM0_Qa + 1.0;
        }
        else {
          local_c8 = 2.0 / local_78;
          local_c0 = -2.0 / local_78;
          local_b8 = 2.0 / local_78;
        }
        local_c0 = local_c0 / local_78;
        local_c8 = local_c8 / local_78;
      }
      iVar1 = N_VLinearCombination(3,&local_c8,&stack0xffffffffffffff08,local_30);
      if (iVar1 != 0) {
        return -0x1c;
      }
      break;
    case (N_Vector)0x3:
      if (local_24 == 0) {
        local_c8 = local_58 * 3.0 + local_60 * 2.0;
        local_c0 = (local_58 * -3.0 + 1.0) - (local_60 + local_60);
        local_b8 = local_78 * (local_58 + local_60);
        local_b0 = local_78 * (local_58 + local_58 + in_XMM0_Qa + local_60);
      }
      else if (local_24 == 1) {
        local_c8 = ((in_XMM0_Qa + local_58) * 6.0) / local_78;
        local_c0 = ((in_XMM0_Qa + local_58) * -6.0) / local_78;
        local_b8 = in_XMM0_Qa + in_XMM0_Qa + local_58 * 3.0;
        local_b0 = local_58 * 3.0 + in_XMM0_Qa * 4.0 + 1.0;
      }
      else if (local_24 == 2) {
        local_c8 = ((in_XMM0_Qa + in_XMM0_Qa + 1.0) * 6.0) / local_80;
        local_c0 = ((in_XMM0_Qa + in_XMM0_Qa + 1.0) * -6.0) / local_80;
        local_b8 = (in_XMM0_Qa * 6.0 + 2.0) / local_78;
        local_b0 = (in_XMM0_Qa * 6.0 + 4.0) / local_78;
      }
      else {
        local_c8 = 12.0 / local_88;
        local_c0 = -12.0 / local_88;
        local_b8 = 6.0 / local_80;
        local_b0 = 6.0 / local_80;
      }
      iVar1 = N_VLinearCombination(4,&local_c8,&stack0xffffffffffffff08,local_30);
      if (iVar1 != 0) {
        return -0x1c;
      }
      break;
    case (N_Vector)0x4:
      local_40 = -0.3333333333333333;
      local_38 = arkInterpEvaluate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                   in_stack_ffffffffffffff08,in_ECX,order_00,yout_00);
      if (local_38 != 0) {
        return -8;
      }
      local_40 = *(double *)(*in_RSI + 0x30) - local_78 / 3.0;
      local_38 = (*in_RDI->step_fullrhs)(in_RDI,local_40,local_30,*(N_Vector *)(*in_RSI + 0x18),2);
      if (local_38 != 0) {
        return -8;
      }
      if (local_24 == 0) {
        local_c8 = local_68 * -9.0 + local_58 * -6.0 + -(local_60 * 16.0);
        local_c0 = local_68 * 9.0 + local_60 * 16.0 + local_58 * 6.0 + 1.0;
        local_b8 = local_78 * 0.25 * (local_68 * -9.0 + local_58 * -5.0 + -(local_60 * 14.0));
        local_b0 = local_78 * (local_58 + local_58 + in_XMM0_Qa + local_60);
        local_a8 = local_78 * 27.0 * 0.25 * ((-local_68 - (local_60 + local_60)) - local_58);
      }
      else if (local_24 == 1) {
        local_c8 = (local_60 * -36.0 + in_XMM0_Qa * -12.0 + -(local_58 * 48.0)) / local_78;
        local_c0 = (local_60 * 36.0 + in_XMM0_Qa * 12.0 + local_58 * 48.0) / local_78;
        local_b8 = (local_60 * -18.0 + in_XMM0_Qa * -5.0 + -(local_58 * 21.0)) * 0.5;
        local_b0 = local_58 * 3.0 + in_XMM0_Qa * 4.0 + 1.0;
        local_a8 = (local_60 + local_60 + local_58 * 3.0 + in_XMM0_Qa) * -13.5;
      }
      else if (local_24 == 2) {
        local_c8 = (local_58 * -108.0 + in_XMM0_Qa * -96.0 + -12.0) / local_80;
        local_c0 = (local_58 * 108.0 + in_XMM0_Qa * 96.0 + 12.0) / local_80;
        local_b8 = (local_58 * -27.0 + in_XMM0_Qa * -21.0 + -2.5) / local_78;
        local_b0 = (in_XMM0_Qa * 6.0 + 4.0) / local_78;
        local_a8 = (local_58 * -81.0 + in_XMM0_Qa * -81.0 + -13.5) / local_78;
      }
      else if (local_24 == 3) {
        local_c8 = (in_XMM0_Qa * -216.0 + -96.0) / local_88;
        local_c0 = (in_XMM0_Qa * 216.0 + 96.0) / local_88;
        local_b8 = (in_XMM0_Qa * -54.0 + -21.0) / local_80;
        local_b0 = 6.0 / local_80;
        local_a8 = (in_XMM0_Qa * -162.0 + -81.0) / local_80;
      }
      else {
        local_c8 = -216.0 / local_90;
        local_c0 = 216.0 / local_90;
        local_b8 = -54.0 / local_88;
        local_b0 = 0.0;
        local_a8 = -162.0 / local_88;
      }
      iVar1 = N_VLinearCombination(5,&local_c8,&stack0xffffffffffffff08,local_30);
      if (iVar1 != 0) {
        return -0x1c;
      }
      break;
    case (N_Vector)0x5:
      local_40 = -0.3333333333333333;
      local_38 = arkInterpEvaluate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                   in_stack_ffffffffffffff08,in_ECX,order_00,yout_00);
      if (local_38 != 0) {
        return -8;
      }
      local_40 = *(double *)(*in_RSI + 0x30) - local_78 / 3.0;
      local_38 = (*in_RDI->step_fullrhs)(in_RDI,local_40,local_30,*(N_Vector *)(*in_RSI + 0x18),2);
      if (local_38 != 0) {
        return -8;
      }
      local_40 = -0.6666666666666666;
      local_38 = arkInterpEvaluate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                   in_stack_ffffffffffffff08,in_ECX,order_00,yout_00);
      if (local_38 != 0) {
        return -8;
      }
      local_40 = *(double *)(*in_RSI + 0x30) - (local_78 * 2.0) / 3.0;
      local_38 = (*in_RDI->step_fullrhs)(in_RDI,local_40,local_30,*(N_Vector *)(*in_RSI + 0x20),2);
      if (local_38 != 0) {
        return -8;
      }
      if (local_24 == 0) {
        local_c8 = local_58 * 30.0 + local_60 * 110.0 + local_70 * 54.0 + local_68 * 135.0;
        local_c0 = 1.0 - local_c8;
        local_b8 = (local_78 / 4.0) *
                   (local_58 * 13.0 + local_60 * 49.0 + local_70 * 27.0 + local_68 * 63.0);
        local_b0 = (local_78 / 4.0) *
                   (in_XMM0_Qa * 4.0 +
                   local_58 * 26.0 + local_60 * 67.0 + local_70 * 27.0 + local_68 * 72.0);
        local_a8 = (local_78 / 4.0) *
                   (local_58 * 27.0 + local_60 * 135.0 + local_70 * 81.0 + local_68 * 189.0);
        local_a0 = (local_78 / 4.0) *
                   (local_58 * 54.0 + local_60 * 189.0 + local_70 * 81.0 + local_68 * 216.0);
      }
      else {
        if (local_24 == 1) {
          local_c8 = (in_XMM0_Qa * 60.0 + local_58 * 330.0 + local_68 * 270.0 + local_60 * 540.0) /
                     local_78;
          local_b8 = (in_XMM0_Qa * 26.0 + local_58 * 147.0 + local_68 * 135.0 + local_60 * 252.0) /
                     4.0;
          local_b0 = (in_XMM0_Qa * 52.0 + local_58 * 201.0 + local_68 * 135.0 + local_60 * 288.0 +
                     4.0) / 4.0;
          local_a8 = (in_XMM0_Qa * 54.0 + local_58 * 405.0 + local_68 * 405.0 + local_60 * 756.0) /
                     4.0;
          local_a0 = (in_XMM0_Qa * 108.0 + local_58 * 567.0 + local_68 * 405.0 + local_60 * 864.0) /
                     4.0;
        }
        else if (local_24 == 2) {
          local_c8 = (in_XMM0_Qa * 660.0 + local_60 * 1080.0 + local_58 * 1620.0 + 60.0) / local_80;
          local_b8 = (in_XMM0_Qa * 147.0 + local_60 * 270.0 + local_58 * 378.0 + 13.0) /
                     (local_78 * 2.0);
          local_b0 = (in_XMM0_Qa * 201.0 + local_60 * 270.0 + local_58 * 432.0 + 26.0) /
                     (local_78 * 2.0);
          local_a8 = (in_XMM0_Qa * 405.0 + local_60 * 810.0 + local_58 * 1134.0 + 27.0) /
                     (local_78 * 2.0);
          local_a0 = (in_XMM0_Qa * 567.0 + local_60 * 810.0 + local_58 * 1296.0 + 54.0) /
                     (local_78 * 2.0);
        }
        else if (local_24 == 3) {
          local_c8 = (local_58 * 3240.0 + in_XMM0_Qa * 3240.0 + 660.0) / local_88;
          local_b8 = (local_58 * 810.0 + in_XMM0_Qa * 756.0 + 147.0) / (local_80 * 2.0);
          local_b0 = (local_58 * 810.0 + in_XMM0_Qa * 864.0 + 201.0) / (local_80 * 2.0);
          local_a8 = (local_58 * 2430.0 + in_XMM0_Qa * 2268.0 + 405.0) / (local_80 * 2.0);
          local_a0 = (local_58 * 2430.0 + in_XMM0_Qa * 2592.0 + 567.0) / (local_80 * 2.0);
        }
        else if (local_24 == 4) {
          local_c8 = (in_XMM0_Qa * 6480.0 + 3240.0) / local_90;
          local_b8 = (in_XMM0_Qa * 810.0 + 378.0) / local_88;
          local_b0 = (in_XMM0_Qa * 810.0 + 432.0) / local_88;
          local_a8 = (in_XMM0_Qa * 2430.0 + 1134.0) / local_88;
          local_a0 = (in_XMM0_Qa * 2430.0 + 1296.0) / local_88;
        }
        else {
          local_c8 = 6480.0 / local_98;
          local_b8 = 810.0 / local_90;
          local_a8 = 2430.0 / local_90;
          local_b0 = local_b8;
          local_a0 = local_a8;
        }
        local_c0 = -local_c8;
      }
      iVar1 = N_VLinearCombination(6,&local_c8,&stack0xffffffffffffff08,local_30);
      if (iVar1 != 0) {
        return -0x1c;
      }
      break;
    default:
      arkProcessError(in_RDI,-0x16,0x307,"arkInterpEvaluate_Hermite",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_interp.c"
                      ,"Illegal polynomial order");
      return -0x16;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkInterpEvaluate_Hermite(ARKodeMem ark_mem, ARKInterp interp,
                              sunrealtype tau, int d, int order, N_Vector yout)
{
  /* local variables */
  int q, retval;
  sunrealtype tval, a0, a1, tau2, tau3, tau4, tau5;
  sunrealtype h, h2, h3, h4, h5;
  sunrealtype a[6];
  N_Vector X[6];

  /* set constants */
  tau2 = tau * tau;
  tau3 = tau * tau2;
  tau4 = tau * tau3;
  tau5 = tau * tau4;

  h  = HINT_H(interp);
  h2 = h * h;
  h3 = h * h2;
  h4 = h * h3;
  h5 = h * h4;

  /* determine polynomial order q */
  q = SUNMAX(order, 0);               /* respect lower bound  */
  q = SUNMIN(q, HINT_DEGREE(interp)); /* respect max possible */

  SUNLogDebug(ARK_LOGGER, "interp-eval",
              "tau = " SUN_FORMAT_G ", d = %i, q = %i", tau, d, q);

  /* call full RHS if needed -- called just AFTER the end of a step, so yn has
     been updated to ycur */
  if (!(ark_mem->fn_is_current))
  {
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                   ark_mem->fn, ARK_FULLRHS_END);
    if (retval) { return ARK_RHSFUNC_FAIL; }
    ark_mem->fn_is_current = SUNTRUE;
  }

  /* error on illegal d */
  if (d < 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Requested illegal derivative.");
    return (ARK_ILL_INPUT);
  }

  /* if d is too high, just return zeros */
  if (d > q)
  {
    N_VConst(ZERO, yout);
    return (ARK_SUCCESS);
  }

  /* build polynomial based on order */
  switch (q)
  {
  case (0): /* constant interpolant, yout = 0.5*(yn+yp) */
    N_VLinearSum(HALF, HINT_YOLD(interp), HALF, ark_mem->yn, yout);
    break;

  case (1): /* linear interpolant */
    if (d == 0)
    {
      a0 = -tau;
      a1 = ONE + tau;
    }
    else
    { /* d=1 */
      a0 = -ONE / h;
      a1 = ONE / h;
    }
    N_VLinearSum(a0, HINT_YOLD(interp), a1, ark_mem->yn, yout);
    break;

  case (2): /* quadratic interpolant */
    if (d == 0)
    {
      a[0] = tau2;
      a[1] = ONE - tau2;
      a[2] = h * (tau2 + tau);
    }
    else if (d == 1)
    {
      a[0] = TWO * tau / h;
      a[1] = -TWO * tau / h;
      a[2] = (ONE + TWO * tau);
    }
    else
    { /* d == 2 */
      a[0] = TWO / h / h;
      a[1] = -TWO / h / h;
      a[2] = TWO / h;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = ark_mem->fn;
    retval = N_VLinearCombination(3, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (3): /* cubic interpolant */
    if (d == 0)
    {
      a[0] = THREE * tau2 + TWO * tau3;
      a[1] = ONE - THREE * tau2 - TWO * tau3;
      a[2] = h * (tau2 + tau3);
      a[3] = h * (tau + TWO * tau2 + tau3);
    }
    else if (d == 1)
    {
      a[0] = SIX * (tau + tau2) / h;
      a[1] = -SIX * (tau + tau2) / h;
      a[2] = TWO * tau + THREE * tau2;
      a[3] = ONE + FOUR * tau + THREE * tau2;
    }
    else if (d == 2)
    {
      a[0] = SIX * (ONE + TWO * tau) / h2;
      a[1] = -SIX * (ONE + TWO * tau) / h2;
      a[2] = (TWO + SIX * tau) / h;
      a[3] = (FOUR + SIX * tau) / h;
    }
    else
    { /* d == 3 */
      a[0] = TWELVE / h3;
      a[1] = -TWELVE / h3;
      a[2] = SIX / h2;
      a[3] = SIX / h2;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    retval = N_VLinearCombination(4, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (4): /* quartic interpolant */

    /* first, evaluate cubic interpolant at tau=-1/3 */
    tval   = -ONE / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 3, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* second, evaluate RHS at tau=-1/3, storing the result in fa */
    tval   = HINT_TNEW(interp) - h / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FA(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* evaluate desired function */
    if (d == 0)
    {
      a[0] = -SIX * tau2 - SUN_RCONST(16.0) * tau3 - SUN_RCONST(9.0) * tau4;
      a[1] = ONE + SIX * tau2 + SUN_RCONST(16.0) * tau3 + SUN_RCONST(9.0) * tau4;
      a[2] = h * FOURTH *
             (-FIVE * tau2 - SUN_RCONST(14.0) * tau3 - SUN_RCONST(9.0) * tau4);
      a[3] = h * (tau + TWO * tau2 + tau3);
      a[4] = h * SUN_RCONST(27.0) * FOURTH * (-tau4 - TWO * tau3 - tau2);
    }
    else if (d == 1)
    {
      a[0] =
        (-TWELVE * tau - SUN_RCONST(48.0) * tau2 - SUN_RCONST(36.0) * tau3) / h;
      a[1] = (TWELVE * tau + SUN_RCONST(48.0) * tau2 + SUN_RCONST(36.0) * tau3) /
             h;
      a[2] = HALF *
             (-FIVE * tau - SUN_RCONST(21.0) * tau2 - SUN_RCONST(18.0) * tau3);
      a[3] = (ONE + FOUR * tau + THREE * tau2);
      a[4] = -SUN_RCONST(27.0) * HALF * (TWO * tau3 + THREE * tau2 + tau);
    }
    else if (d == 2)
    {
      a[0] = (-TWELVE - SUN_RCONST(96.0) * tau - SUN_RCONST(108.0) * tau2) / h2;
      a[1] = (TWELVE + SUN_RCONST(96.0) * tau + SUN_RCONST(108.0) * tau2) / h2;
      a[2] = (-FIVE * HALF - SUN_RCONST(21.0) * tau - SUN_RCONST(27.0) * tau2) /
             h;
      a[3] = (FOUR + SIX * tau) / h;
      a[4] = (-SUN_RCONST(27.0) * HALF - SUN_RCONST(81.0) * tau -
              SUN_RCONST(81.0) * tau2) /
             h;
    }
    else if (d == 3)
    {
      a[0] = (-SUN_RCONST(96.0) - SUN_RCONST(216.0) * tau) / h3;
      a[1] = (SUN_RCONST(96.0) + SUN_RCONST(216.0) * tau) / h3;
      a[2] = (-SUN_RCONST(21.0) - SUN_RCONST(54.0) * tau) / h2;
      a[3] = SIX / h2;
      a[4] = (-SUN_RCONST(81.0) - SUN_RCONST(162.0) * tau) / h2;
    }
    else
    { /* d == 4 */
      a[0] = -SUN_RCONST(216.0) / h4;
      a[1] = SUN_RCONST(216.0) / h4;
      a[2] = -SUN_RCONST(54.0) / h3;
      a[3] = ZERO;
      a[4] = -SUN_RCONST(162.0) / h3;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    X[4]   = HINT_FA(interp);
    retval = N_VLinearCombination(5, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (5): /* quintic interpolant */

    /* first, evaluate quartic interpolant at tau=-1/3 */
    tval   = -ONE / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 4, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* second, evaluate RHS at tau=-1/3, storing the result in fa */
    tval   = HINT_TNEW(interp) - h / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FA(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* third, evaluate quartic interpolant at tau=-2/3 */
    tval   = -TWO / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 4, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* fourth, evaluate RHS at tau=-2/3, storing the result in fb */
    tval   = HINT_TNEW(interp) - h * TWO / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FB(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* evaluate desired function */
    if (d == 0)
    {
      a[0] = SUN_RCONST(54.0) * tau5 + SUN_RCONST(135.0) * tau4 +
             SUN_RCONST(110.0) * tau3 + SUN_RCONST(30.0) * tau2;
      a[1] = ONE - a[0];
      a[2] = h / FOUR *
             (SUN_RCONST(27.0) * tau5 + SUN_RCONST(63.0) * tau4 +
              SUN_RCONST(49.0) * tau3 + SUN_RCONST(13.0) * tau2);
      a[3] = h / FOUR *
             (SUN_RCONST(27.0) * tau5 + SUN_RCONST(72.0) * tau4 +
              SUN_RCONST(67.0) * tau3 + SUN_RCONST(26.0) * tau2 + FOUR * tau);
      a[4] = h / FOUR *
             (SUN_RCONST(81.0) * tau5 + SUN_RCONST(189.0) * tau4 +
              SUN_RCONST(135.0) * tau3 + SUN_RCONST(27.0) * tau2);
      a[5] = h / FOUR *
             (SUN_RCONST(81.0) * tau5 + SUN_RCONST(216.0) * tau4 +
              SUN_RCONST(189.0) * tau3 + SUN_RCONST(54.0) * tau2);
    }
    else if (d == 1)
    {
      a[0] = (SUN_RCONST(270.0) * tau4 + SUN_RCONST(540.0) * tau3 +
              SUN_RCONST(330.0) * tau2 + SUN_RCONST(60.0) * tau) /
             h;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(135.0) * tau4 + SUN_RCONST(252.0) * tau3 +
              SUN_RCONST(147.0) * tau2 + SUN_RCONST(26.0) * tau) /
             FOUR;
      a[3] = (SUN_RCONST(135.0) * tau4 + SUN_RCONST(288.0) * tau3 +
              SUN_RCONST(201.0) * tau2 + SUN_RCONST(52.0) * tau + FOUR) /
             FOUR;
      a[4] = (SUN_RCONST(405.0) * tau4 + SUN_RCONST(4.0) * 189 * tau3 +
              SUN_RCONST(405.0) * tau2 + SUN_RCONST(54.0) * tau) /
             FOUR;
      a[5] = (SUN_RCONST(405.0) * tau4 + SUN_RCONST(864.0) * tau3 +
              SUN_RCONST(567.0) * tau2 + SUN_RCONST(108.0) * tau) /
             FOUR;
    }
    else if (d == 2)
    {
      a[0] = (SUN_RCONST(1080.0) * tau3 + SUN_RCONST(1620.0) * tau2 +
              SUN_RCONST(660.0) * tau + SUN_RCONST(60.0)) /
             h2;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(270.0) * tau3 + SUN_RCONST(378.0) * tau2 +
              SUN_RCONST(147.0) * tau + SUN_RCONST(13.0)) /
             (TWO * h);
      a[3] = (SUN_RCONST(270.0) * tau3 + SUN_RCONST(432.0) * tau2 +
              SUN_RCONST(201.0) * tau + SUN_RCONST(26.0)) /
             (TWO * h);
      a[4] = (SUN_RCONST(810.0) * tau3 + SUN_RCONST(1134.0) * tau2 +
              SUN_RCONST(405.0) * tau + SUN_RCONST(27.0)) /
             (TWO * h);
      a[5] = (SUN_RCONST(810.0) * tau3 + SUN_RCONST(1296.0) * tau2 +
              SUN_RCONST(567.0) * tau + SUN_RCONST(54.0)) /
             (TWO * h);
    }
    else if (d == 3)
    {
      a[0] = (SUN_RCONST(3240.0) * tau2 + SUN_RCONST(3240.0) * tau +
              SUN_RCONST(660.0)) /
             h3;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(810.0) * tau2 + SUN_RCONST(756.0) * tau +
              SUN_RCONST(147.0)) /
             (TWO * h2);
      a[3] = (SUN_RCONST(810.0) * tau2 + SUN_RCONST(864.0) * tau +
              SUN_RCONST(201.0)) /
             (TWO * h2);
      a[4] = (SUN_RCONST(2430.0) * tau2 + SUN_RCONST(2268.0) * tau +
              SUN_RCONST(405.0)) /
             (TWO * h2);
      a[5] = (SUN_RCONST(2430.0) * tau2 + SUN_RCONST(2592.0) * tau +
              SUN_RCONST(567.0)) /
             (TWO * h2);
    }
    else if (d == 4)
    {
      a[0] = (SUN_RCONST(6480.0) * tau + SUN_RCONST(3240.0)) / h4;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(810.0) * tau + SUN_RCONST(378.0)) / h3;
      a[3] = (SUN_RCONST(810.0) * tau + SUN_RCONST(432.0)) / h3;
      a[4] = (SUN_RCONST(2430.0) * tau + SUN_RCONST(1134.0)) / h3;
      a[5] = (SUN_RCONST(2430.0) * tau + SUN_RCONST(1296.0)) / h3;
    }
    else
    { /* d == 5 */
      a[0] = SUN_RCONST(6480.0) / h5;
      a[1] = -a[0];
      a[2] = SUN_RCONST(810.0) / h4;
      a[3] = a[2];
      a[4] = SUN_RCONST(2430.0) / h4;
      a[5] = a[4];
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    X[4]   = HINT_FA(interp);
    X[5]   = HINT_FB(interp);
    retval = N_VLinearCombination(6, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal polynomial order");
    return (ARK_ILL_INPUT);
  }

  return (ARK_SUCCESS);
}